

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math_test.cpp
# Opt level: O0

void __thiscall Math_InnerProduct_Test::TestBody(Math_InnerProduct_Test *this)

{
  bool bVar1;
  Float FVar2;
  Float FVar3;
  Float FVar4;
  Float FVar5;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  AssertionResult gtest_ar;
  Float dab;
  Float ab;
  Float b [4];
  Float a [4];
  anon_class_8_1_ba1d750b r;
  RNG rng;
  int i;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  RNG *in_stack_ffffffffffffff50;
  RNG *expected;
  anon_class_8_1_ba1d750b *this_00;
  undefined4 uVar13;
  int line;
  AssertionResult *this_01;
  Type in_stack_ffffffffffffff7c;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_60;
  float local_50;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  local_4c;
  Float local_48;
  Float local_44;
  Float local_40;
  float local_3c;
  anon_class_8_1_ba1d750b local_28;
  RNG local_20;
  int local_c;
  
  for (local_c = 0; local_c < 100000; local_c = local_c + 1) {
    expected = &local_20;
    pbrt::RNG::RNG(in_stack_ffffffffffffff50,
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    this_00 = &local_28;
    uVar13 = 0xfffffff6;
    line = 10;
    local_28.rng = expected;
    FVar2 = TestBody::anon_class_8_1_ba1d750b::operator()
                      (this_00,(int)((ulong)expected >> 0x20),(int)expected);
    FVar3 = TestBody::anon_class_8_1_ba1d750b::operator()
                      (this_00,(int)((ulong)expected >> 0x20),(int)expected);
    FVar4 = TestBody::anon_class_8_1_ba1d750b::operator()
                      (this_00,(int)((ulong)expected >> 0x20),(int)expected);
    FVar5 = TestBody::anon_class_8_1_ba1d750b::operator()
                      (this_00,(int)((ulong)expected >> 0x20),(int)expected);
    local_48 = TestBody::anon_class_8_1_ba1d750b::operator()
                         (this_00,(int)((ulong)expected >> 0x20),(int)expected);
    local_44 = TestBody::anon_class_8_1_ba1d750b::operator()
                         (this_00,(int)((ulong)expected >> 0x20),(int)expected);
    local_40 = TestBody::anon_class_8_1_ba1d750b::operator()
                         (this_00,(int)((ulong)expected >> 0x20),(int)expected);
    local_3c = TestBody::anon_class_8_1_ba1d750b::operator()
                         (this_00,(int)((ulong)expected >> 0x20),(int)expected);
    local_4c = pbrt::InnerProduct<float,float,float,float,float,float,float,float>
                         ((float)((ulong)this_00 >> 0x20),SUB84(this_00,0),
                          (float)((ulong)expected >> 0x20),SUB84(expected,0),
                          (float)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                          SUB84(in_stack_ffffffffffffff50,0),in_stack_ffffffffffffff4c,
                          in_stack_ffffffffffffff48);
    auVar6._0_8_ = (double)FVar2;
    auVar6._8_8_ = extraout_XMM0_Qb;
    auVar9._0_8_ = (double)local_48;
    auVar9._8_8_ = 0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = (double)FVar3 * (double)local_44;
    auVar6 = vfmadd213sd_fma(auVar9,auVar6,auVar11);
    auVar7._0_8_ = (double)FVar4;
    auVar7._8_8_ = extraout_XMM0_Qb;
    auVar12._0_8_ = (double)local_40;
    auVar12._8_8_ = 0;
    auVar6 = vfmadd213sd_fma(auVar12,auVar7,auVar6);
    auVar8._0_8_ = (double)FVar5;
    auVar8._8_8_ = extraout_XMM0_Qb;
    auVar10._0_8_ = (double)local_3c;
    auVar10._8_8_ = 0;
    auVar6 = vfmadd213sd_fma(auVar10,auVar8,auVar6);
    local_50 = (float)auVar6._0_8_;
    this_01 = &local_60;
    testing::internal::EqHelper<false>::Compare<float,float>
              ((char *)CONCAT44(line,uVar13),(char *)this_00,(float *)expected,
               (float *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
    in_stack_ffffffffffffff7c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff7c);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff50 =
           (RNG *)testing::AssertionResult::failure_message((AssertionResult *)0x5fb52f);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,&this_01->success_,line,
                 (char *)this_00);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(FVar5,FVar4),(Message *)CONCAT44(FVar3,FVar2));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0x5fb57d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5fb5bd);
  }
  return;
}

Assistant:

TEST(Math, InnerProduct) {
    for (int i = 0; i < 100000; ++i) {
        RNG rng(i);
        auto r = [&rng](int minExp = -10, int maxExp = 10) {
            Float logu = Lerp(rng.Uniform<Float>(), minExp, maxExp);
            Float val = std::pow(10, logu);
            Float sign = rng.Uniform<Float>() < .5 ? -1. : 1.;
            return val * sign;
        };

        Float a[4] = {r(), r(), r(), r()};
        Float b[4] = {r(), r(), r(), r()};
        Float ab = (Float)InnerProduct(a[0], b[0], a[1], b[1], a[2], b[2], a[3], b[3]);
        Float dab = double(a[0]) * double(b[0]) + double(a[1]) * double(b[1]) +
                    double(a[2]) * double(b[2]) + double(a[3]) * double(b[3]);
        EXPECT_EQ(ab, dab);
    }
}